

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O3

ModportPortSymbol *
slang::ast::ModportPortSymbol::fromSyntax
          (ASTContext *context,ArgumentDirection direction,ModportNamedPortSyntax *syntax)

{
  SymbolIndex SVar1;
  Scope *pSVar2;
  Compilation *this;
  Scope *pSVar3;
  SourceLocation location;
  ModportPortSymbol *pMVar4;
  bool bVar5;
  Symbol *pSVar6;
  DeclaredType *target;
  Expression *this_00;
  Diagnostic *pDVar7;
  bitmask<slang::ast::AssignFlags> flags;
  DiagCode code;
  string_view sVar8;
  SourceRange SVar9;
  LookupLocation location_00;
  Token name;
  ASTContext checkCtx;
  undefined1 constraintAllowed;
  ArgumentDirection local_ac;
  Token local_a8;
  Compilation *local_90;
  ModportPortSymbol *local_88;
  SourceRange local_80;
  SourceLocation local_70;
  ASTContext local_68;
  
  pSVar2 = (context->scope).ptr;
  local_ac = direction;
  if (pSVar2 != (Scope *)0x0) {
    this = pSVar2->compilation;
    local_a8.kind = (syntax->name).kind;
    local_a8._2_1_ = (syntax->name).field_0x2;
    local_a8.numFlags.raw = (syntax->name).numFlags.raw;
    local_a8.rawLen = (syntax->name).rawLen;
    local_a8.info = (syntax->name).info;
    local_68._0_16_ = parsing::Token::valueText(&local_a8);
    local_70 = parsing::Token::location(&local_a8);
    local_90 = this;
    local_88 = BumpAllocator::
               emplace<slang::ast::ModportPortSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::ArgumentDirection&>
                         (&this->super_BumpAllocator,
                          (basic_string_view<char,_std::char_traits<char>_> *)&local_68,&local_70,
                          &local_ac);
    (local_88->super_ValueSymbol).super_Symbol.originatingSyntax = (SyntaxNode *)syntax;
    pSVar2 = (context->scope).ptr;
    if (pSVar2 != (Scope *)0x0) {
      sVar8 = parsing::Token::valueText(&local_a8);
      pSVar3 = (context->scope).ptr;
      if (pSVar3 != (Scope *)0x0) {
        SVar1 = context->lookupIndex;
        local_80 = parsing::Token::range(&local_a8);
        constraintAllowed = local_80.startLoc._0_1_;
        location_00.index = SVar1;
        location_00.scope = pSVar3;
        location_00._12_4_ = 0;
        pSVar6 = Lookup::unqualifiedAt
                           (pSVar2,sVar8,location_00,local_80,(bitmask<slang::ast::LookupFlags>)0x40
                           );
        pMVar4 = local_88;
        local_88->internalSymbol = pSVar6;
        if (pSVar6 != (Symbol *)0x0) {
          code.subsystem = Declarations;
          code.code = 0x22;
          if (pSVar6->kind != Subroutine) {
            bVar5 = SemanticFacts::isAllowedInModport(pSVar6->kind);
            code.subsystem = Declarations;
            code.code = 0x6a;
            if (bVar5) {
              if (pMVar4->internalSymbol != (Symbol *)0x0) {
                target = Symbol::getDeclaredType(pMVar4->internalSymbol);
                if (target == (DeclaredType *)0x0) {
                  assert::assertFailed
                            ("sourceType",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                             ,0xbd,
                             "static ModportPortSymbol &slang::ast::ModportPortSymbol::fromSyntax(const ASTContext &, ArgumentDirection, const ModportNamedPortSyntax &)"
                            );
                }
                DeclaredType::setLink(&(pMVar4->super_ValueSymbol).declaredType,target);
                if (local_ac == In) {
                  return pMVar4;
                }
                ASTContext::resetFlags(&local_68,context,(bitmask<slang::ast::ASTFlags>)0x80);
                location = (pMVar4->super_ValueSymbol).super_Symbol.location;
                SVar9.startLoc =
                     (pMVar4->super_ValueSymbol).super_Symbol.name._M_len * 0x10000000 +
                     (long)location;
                SVar9.endLoc = (SourceLocation)0x0;
                this_00 = ValueExpressionBase::fromSymbol
                                    ((ValueExpressionBase *)&local_68,
                                     (ASTContext *)pMVar4->internalSymbol,(Symbol *)0x0,
                                     location._0_1_,SVar9,(bool)constraintAllowed);
                if (local_ac == Ref) {
                  bVar5 = Expression::canConnectToRefArg(this_00,false,false);
                  if (bVar5) {
                    return pMVar4;
                  }
                  pDVar7 = ASTContext::addDiag(&local_68,(DiagCode)0x590007,location);
                  Diagnostic::operator<<(pDVar7,this_00->sourceRange);
                  return pMVar4;
                }
                if (local_ac == InOut) {
                  flags.m_bits = 0x210;
                }
                else {
                  if (local_ac != Out) {
                    return pMVar4;
                  }
                  flags.m_bits = 0x200;
                }
                Expression::requireLValue
                          (this_00,&local_68,location,flags,(Expression *)0x0,(EvalContext *)0x0);
                return pMVar4;
              }
              goto LAB_001cad5f;
            }
          }
          SVar9 = parsing::Token::range(&local_a8);
          pDVar7 = ASTContext::addDiag(context,code,SVar9);
          sVar8 = parsing::Token::valueText(&local_a8);
          Diagnostic::operator<<(pDVar7,sVar8);
          Diagnostic::addNote(pDVar7,(DiagCode)0x40001,pMVar4->internalSymbol->location);
          pMVar4->internalSymbol = (Symbol *)0x0;
        }
LAB_001cad5f:
        (pMVar4->super_ValueSymbol).declaredType.type = local_90->errorType;
        return pMVar4;
      }
    }
  }
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,
             "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]"
            );
}

Assistant:

ModportPortSymbol& ModportPortSymbol::fromSyntax(const ASTContext& context,
                                                 ArgumentDirection direction,
                                                 const ModportNamedPortSyntax& syntax) {
    auto& comp = context.getCompilation();
    auto name = syntax.name;
    auto result = comp.emplace<ModportPortSymbol>(name.valueText(), name.location(), direction);
    result->setSyntax(syntax);
    result->internalSymbol = Lookup::unqualifiedAt(*context.scope, name.valueText(),
                                                   context.getLocation(), name.range(),
                                                   LookupFlags::NoParentScope);

    if (result->internalSymbol) {
        if (result->internalSymbol->kind == SymbolKind::Subroutine) {
            auto& diag = context.addDiag(diag::ExpectedImportExport, name.range());
            diag << name.valueText();
            diag.addNote(diag::NoteDeclarationHere, result->internalSymbol->location);
            result->internalSymbol = nullptr;
        }
        else if (!SemanticFacts::isAllowedInModport(result->internalSymbol->kind)) {
            auto& diag = context.addDiag(diag::NotAllowedInModport, name.range());
            diag << name.valueText();
            diag.addNote(diag::NoteDeclarationHere, result->internalSymbol->location);
            result->internalSymbol = nullptr;
        }
    }

    if (!result->internalSymbol) {
        result->setType(comp.getErrorType());
        return *result;
    }

    auto sourceType = result->internalSymbol->getDeclaredType();
    ASSERT(sourceType);
    result->getDeclaredType()->setLink(*sourceType);

    // Perform checking on the connected symbol to make sure it's allowed
    // given the modport's direction.
    if (direction != ArgumentDirection::In) {
        ASTContext checkCtx = context.resetFlags(ASTFlags::NonProcedural);

        auto loc = result->location;
        auto& expr = ValueExpressionBase::fromSymbol(checkCtx, *result->internalSymbol, false,
                                                     {loc, loc + result->name.length()});

        switch (direction) {
            case ArgumentDirection::In:
                // unreachable
                break;
            case ArgumentDirection::Out:
                expr.requireLValue(checkCtx, loc, AssignFlags::ModportConn);
                break;
            case ArgumentDirection::InOut:
                expr.requireLValue(checkCtx, loc,
                                   AssignFlags::ModportConn | AssignFlags::InOutPort);
                break;
            case ArgumentDirection::Ref:
                if (!expr.canConnectToRefArg(/* isConstRef */ false))
                    checkCtx.addDiag(diag::InvalidRefArg, loc) << expr.sourceRange;
                break;
        }
    }

    return *result;
}